

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc_test.c
# Opt level: O1

int LowMC_test_vector_192_192_4_4(void)

{
  int iVar1;
  uint8_t ciphertext_expected [24];
  uint8_t plaintext [24];
  uint8_t key [24];
  uint8_t local_58 [32];
  uint8_t local_38 [32];
  uint8_t local_18 [24];
  
  local_18[0] = 'V';
  local_18[1] = 0x9d;
  local_18[2] = '}';
  local_18[3] = 0x82;
  local_18[4] = '#';
  local_18[5] = '\0';
  local_18[6] = 0x94;
  local_18[7] = '=';
  local_18[8] = 0x94;
  local_18[9] = 0x83;
  local_18[10] = 'G';
  local_18[0xb] = 't';
  local_18[0xc] = '\'';
  local_18[0xd] = 0xe8;
  local_18[0xe] = 0x8e;
  local_18[0xf] = 0xa2;
  local_18[0x10] = '\'';
  local_18[0x11] = 0xa2;
  local_18[0x12] = 0xe3;
  local_18[0x13] = '\x17';
  local_18[0x14] = ',';
  local_18[0x15] = '\x04';
  local_18[0x16] = 0xbc;
  local_18[0x17] = 0xd3;
  local_38[0] = 0xae;
  local_38[1] = 0xeb;
  local_38[2] = 0x9d;
  local_38[3] = '[';
  local_38[4] = 'a';
  local_38[5] = 0xa2;
  local_38[6] = 0xa5;
  local_38[7] = 'm';
  local_38[8] = 0xd5;
  local_38[9] = 0x98;
  local_38[10] = 0xf7;
  local_38[0xb] = 0xda;
  local_38[0xc] = '&';
  local_38[0xd] = 0xdf;
  local_38[0xe] = 0xd7;
  local_38[0xf] = 0x8c;
  local_38[0x10] = 0xc9;
  local_38[0x11] = 0x92;
  local_38[0x12] = 0xe0;
  local_38[0x13] = 0xae;
  local_38[0x14] = 0xa3;
  local_38[0x15] = 0xfc;
  local_38[0x16] = '.';
  local_38[0x17] = '9';
  local_58[0] = 0x86;
  local_58[1] = 0x98;
  local_58[2] = 'p';
  local_58[3] = 0xae;
  local_58[4] = 'e';
  local_58[5] = 'G';
  local_58[6] = 0xad;
  local_58[7] = '\n';
  local_58[8] = 0xfe;
  local_58[9] = 0xf2;
  local_58[10] = 'w';
  local_58[0xb] = 0x93;
  local_58[0xc] = '\x17';
  local_58[0xd] = '\r';
  local_58[0xe] = 0x96;
  local_58[0xf] = 0xbc;
  local_58[0x10] = 'x';
  local_58[0x11] = 0xe0;
  local_58[0x12] = '@';
  local_58[0x13] = '\t';
  local_58[0x14] = 'i';
  local_58[0x15] = 'D';
  local_58[0x16] = 0x80;
  local_58[0x17] = 0x8f;
  iVar1 = lowmc_enc(&parameters_192_192_4,local_18,local_38,local_58);
  return iVar1;
}

Assistant:

static int LowMC_test_vector_192_192_4_4(void) {
  const uint8_t key[24] = {
      0x56, 0x9d, 0x7d, 0x82, 0x23, 0x0,  0x94, 0x3d, 0x94, 0x83, 0x47, 0x74,
      0x27, 0xe8, 0x8e, 0xa2, 0x27, 0xa2, 0xe3, 0x17, 0x2c, 0x4,  0xbc, 0xd3,
  };
  const uint8_t plaintext[24] = {
      0xae, 0xeb, 0x9d, 0x5b, 0x61, 0xa2, 0xa5, 0x6d, 0xd5, 0x98, 0xf7, 0xda,
      0x26, 0xdf, 0xd7, 0x8c, 0xc9, 0x92, 0xe0, 0xae, 0xa3, 0xfc, 0x2e, 0x39,
  };
  const uint8_t ciphertext_expected[24] = {
      0x86, 0x98, 0x70, 0xae, 0x65, 0x47, 0xad, 0xa, 0xfe, 0xf2, 0x77, 0x93,
      0x17, 0xd,  0x96, 0xbc, 0x78, 0xe0, 0x40, 0x9, 0x69, 0x44, 0x80, 0x8f,
  };
  return lowmc_enc(&parameters_192_192_4, key, plaintext, ciphertext_expected);
}